

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 VGMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT32 UVar1;
  int *piVar2;
  DATA_LOADER *dataLoader_local;
  
  DataLoader_ReadUntil(dataLoader,0x38);
  UVar1 = DataLoader_GetSize(dataLoader);
  if (UVar1 < 0x38) {
    dataLoader_local._7_1_ = 0xf1;
  }
  else {
    piVar2 = (int *)DataLoader_GetData(dataLoader);
    if (*piVar2 == 0x206d6756) {
      dataLoader_local._7_1_ = '\0';
    }
    else {
      dataLoader_local._7_1_ = 0xf0;
    }
  }
  return dataLoader_local._7_1_;
}

Assistant:

UINT8 VGMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x38);
	if (DataLoader_GetSize(dataLoader) < 0x38)
		return 0xF1;	// file too small
	if (memcmp(&DataLoader_GetData(dataLoader)[0x00], "Vgm ", 4))
		return 0xF0;	// invalid signature
	return 0x00;
}